

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_array_global.cpp
# Opt level: O1

MirFunction * __thiscall
optimization::func_array_global::GlobalVarManager::get_init_func(GlobalVarManager *this)

{
  MirPackage *pMVar1;
  mapped_type *pmVar2;
  key_type local_38;
  
  pMVar1 = this->mir;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"main","");
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
           ::at(&pMVar1->functions,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return pmVar2;
}

Assistant:

mir::inst::MirFunction& get_init_func() { return mir.functions.at("main"); }